

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

void SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded
               (cmExecutionStatus *status,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_files_absolute_paths,const_iterator files_it_begin,
               const_iterator files_it_end,bool needed)

{
  undefined3 in_register_00000081;
  string absolute_file_path;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(source_files_absolute_paths,
            (long)files_it_end._M_current - (long)files_it_begin._M_current >> 5);
  if (CONCAT31(in_register_00000081,needed) != 0) {
    for (; files_it_begin._M_current != files_it_end._M_current;
        files_it_begin._M_current = files_it_begin._M_current + 1) {
      MakeSourceFilePathAbsoluteIfNeeded(&absolute_file_path,status,files_it_begin._M_current,true);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(source_files_absolute_paths,&absolute_file_path);
      std::__cxx11::string::~string((string *)&absolute_file_path);
    }
    return;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             source_files_absolute_paths,files_it_begin._M_current,files_it_end._M_current);
  return;
}

Assistant:

void MakeSourceFilePathsAbsoluteIfNeeded(
  cmExecutionStatus& status,
  std::vector<std::string>& source_files_absolute_paths,
  std::vector<std::string>::const_iterator files_it_begin,
  std::vector<std::string>::const_iterator files_it_end, const bool needed)
{

  // Make the file paths absolute, so that relative source file paths are
  // picked up relative to the command calling site, regardless of the
  // directory scope.
  std::vector<std::string>::difference_type num_files =
    files_it_end - files_it_begin;
  source_files_absolute_paths.reserve(num_files);

  if (!needed) {
    source_files_absolute_paths.assign(files_it_begin, files_it_end);
    return;
  }

  for (; files_it_begin != files_it_end; ++files_it_begin) {
    const std::string absolute_file_path =
      MakeSourceFilePathAbsoluteIfNeeded(status, *files_it_begin, true);
    source_files_absolute_paths.push_back(absolute_file_path);
  }
}